

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar2;
  TidyTagId local_e4;
  code *pcStack_d0;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  parserState state;
  Bool exclude_state;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *row_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  memory._44_4_ = 0;
  memory.register_2 = 0;
  if (row == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    memory.register_2 = memory.reentry_node._4_4_;
    memory._44_4_ = memory.reentry_state;
  }
  else {
    pNStack_20 = row;
    if ((row->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
LAB_0014c5e4:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (memory.register_2 == 3) {
            return (Node *)0x0;
          }
          if (memory.register_2 == 0) break;
          if (memory.register_2 == 1) {
            pLVar1->exiled = no;
            pLVar1->excludeBlocks = memory._44_4_;
            memory.register_2 = 0;
          }
          else if (memory.register_2 == 2) {
            pLVar1->excludeBlocks = memory._44_4_;
            while (pLVar1->istackbase < pLVar1->istacksize) {
              prvTidyPopInline(doc,(Node *)0x0);
            }
            memory.register_2 = 0;
          }
        }
        _state = prvTidyGetToken(doc,IgnoreWhitespace);
        if (_state != (Node *)0x0) break;
        memory.register_2 = 3;
      }
      if (_state->tag == pNStack_20->tag) {
        if (_state->type == EndTag) {
          prvTidyFreeNode(doc,_state);
          pNStack_20->closed = yes;
          FixEmptyRow(doc,pNStack_20);
          return (Node *)0x0;
        }
        prvTidyUngetToken(doc);
        FixEmptyRow(doc,pNStack_20);
        return (Node *)0x0;
      }
      if (_state->type != EndTag) break;
      BVar2 = prvTidynodeHasCM(_state,0x82);
      if ((BVar2 != no) ||
         (((_state != (Node *)0x0 && (_state->tag != (Dict *)0x0)) &&
          (_state->tag->id == TidyTag_TABLE)))) {
        if ((_state == (Node *)0x0) || (_state->tag == (Dict *)0x0)) {
          local_e4 = TidyTag_UNKNOWN;
        }
        else {
          local_e4 = _state->tag->id;
        }
        BVar2 = DescendantOf(pNStack_20,local_e4);
        if (BVar2 != no) {
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
      }
      if ((((_state == (Node *)0x0) || (_state->tag == (Dict *)0x0)) ||
          (_state->tag->id != TidyTag_FORM)) && (BVar2 = prvTidynodeHasCM(_state,0x18), BVar2 == no)
         ) {
        if ((((_state == (Node *)0x0) || (_state->tag == (Dict *)0x0)) ||
            (_state->tag->id != TidyTag_TD)) &&
           (((_state == (Node *)0x0 || (_state->tag == (Dict *)0x0)) ||
            (_state->tag->id != TidyTag_TH)))) break;
        prvTidyReport(doc,pNStack_20,_state,0x235);
        prvTidyFreeNode(doc,_state);
      }
      else {
        if (((_state != (Node *)0x0) && (_state->tag != (Dict *)0x0)) &&
           (_state->tag->id == TidyTag_FORM)) {
          BadForm(doc);
        }
        prvTidyReport(doc,pNStack_20,_state,0x235);
        prvTidyFreeNode(doc,_state);
      }
    }
    BVar2 = InsertMisc(pNStack_20,_state);
  } while (BVar2 != no);
  if ((_state->tag == (Dict *)0x0) && (_state->type != TextNode)) {
    prvTidyReport(doc,pNStack_20,_state,0x235);
    prvTidyFreeNode(doc,_state);
    goto LAB_0014c5e4;
  }
  if ((_state != (Node *)0x0) &&
     ((_state->tag != (Dict *)0x0 && (_state->tag->id == TidyTag_TABLE)))) {
    prvTidyReport(doc,pNStack_20,_state,0x235);
    prvTidyFreeNode(doc,_state);
    goto LAB_0014c5e4;
  }
  BVar2 = prvTidynodeHasCM(_state,0x100);
  if (BVar2 != no) {
    prvTidyUngetToken(doc);
    return (Node *)0x0;
  }
  if (_state->type == EndTag) {
    prvTidyReport(doc,pNStack_20,_state,0x235);
    prvTidyFreeNode(doc,_state);
    goto LAB_0014c5e4;
  }
  if (_state->type != EndTag) {
    if (((_state == (Node *)0x0) || (_state->tag == (Dict *)0x0)) ||
       (_state->tag->id != TidyTag_FORM)) {
      BVar2 = prvTidynodeIsText(_state);
      if ((BVar2 != no) || (BVar2 = prvTidynodeHasCM(_state,0x18), BVar2 != no)) {
        MoveBeforeTable(doc,pNStack_20,_state);
        prvTidyReport(doc,pNStack_20,_state,0x27e);
        pLVar1->exiled = yes;
        memory_1.reentry_state = pLVar1->excludeBlocks;
        pLVar1->excludeBlocks = no;
        if (_state->type != TextNode) {
          memset(&memory_2.register_2,0,0x30);
          memory_2._40_8_ = prvTidyParseRow;
          memory_1.identity = (Parser *)pNStack_20;
          memory_1.reentry_node._4_4_ = 1;
          data.reentry_state = 1;
          data.reentry_mode = memory_1.reentry_node._0_4_;
          data.register_1 = memory_1.reentry_state;
          data.mode = memory_1.reentry_mode;
          data.original_node = pNStack_20;
          data.identity = prvTidyParseRow;
          data.reentry_node = _state;
          data.register_2 = memory_1.mode;
          data._44_4_ = memory_1.register_1;
          memory_1.original_node = _state;
          prvTidypushMemory(doc,data);
          return _state;
        }
        pLVar1->exiled = no;
        pLVar1->excludeBlocks = memory_1.reentry_state;
        memory._44_4_ = memory_1.reentry_state;
        goto LAB_0014c5e4;
      }
      if ((_state->tag->model & 4) != 0) {
        prvTidyReport(doc,pNStack_20,_state,0x27e);
        MoveToHead(doc,pNStack_20,_state);
        goto LAB_0014c5e4;
      }
    }
    else {
      prvTidyUngetToken(doc);
      _state = prvTidyInferredTag(doc,TidyTag_TD);
      prvTidyReport(doc,pNStack_20,_state,0x261);
    }
  }
  if ((((_state != (Node *)0x0) && (_state->tag != (Dict *)0x0)) && (_state->tag->id == TidyTag_TD))
     || (((_state != (Node *)0x0 && (_state->tag != (Dict *)0x0)) && (_state->tag->id == TidyTag_TH)
         ))) {
    prvTidyInsertNodeAtEnd(pNStack_20,_state);
    BVar2 = pLVar1->excludeBlocks;
    pLVar1->excludeBlocks = no;
    memset(&pcStack_d0,0,0x30);
    pcStack_d0 = prvTidyParseRow;
    memory_2.identity = (Parser *)pNStack_20;
    memory_2.original_node = _state;
    memory_2.reentry_node._4_4_ = 2;
    data_00.reentry_state = 2;
    data_00.reentry_mode = memory_2.reentry_node._0_4_;
    data_00.register_1 = BVar2;
    data_00.mode = memory_2.reentry_mode;
    data_00.original_node = pNStack_20;
    data_00.identity = prvTidyParseRow;
    data_00.reentry_node = _state;
    data_00.register_2 = memory_2.mode;
    data_00._44_4_ = memory_2.register_1;
    memory_2.reentry_state = BVar2;
    prvTidypushMemory(doc,data_00);
    return _state;
  }
  prvTidyReport(doc,pNStack_20,_state,0x27e);
  prvTidyFreeNode(doc,_state);
  goto LAB_0014c5e4;
}

Assistant:

Node* TY_(ParseRow)( TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool exclude_state = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_ENDTAG,        /* To-do after re-entering after !EndTag checks. */
        STATE_POST_TD_TH,             /* To-do after re-entering after TD/TH checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( row == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        row = memory.original_node;
        state = memory.reentry_state;
        exclude_state = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(row);

        if (row->tag->model & CM_EMPTY)
            return NULL;
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }
    
        switch (state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == row->tag)
                {
                    if (node->type == EndTag)
                    {
                        TY_(FreeNode)( doc, node);
                        row->closed = yes;
                        FixEmptyRow( doc, row);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* New row start implies end of current row */
                    TY_(UngetToken)( doc );
                    FixEmptyRow( doc, row);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if ( node->type == EndTag )
                {
                    if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                         && DescendantOf(row, TagId(node)) )
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* deal with comments etc. */
                if (InsertMisc(row, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* discard unexpected <table> element */
                if ( nodeIsTABLE(node) )
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* THEAD, TFOOT or TBODY */
                if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsFORM(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TD);
                        TY_(Report)(doc, row, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
                    {
                        MoveBeforeTable( doc, row, node );
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;
                        exclude_state = lexer->excludeBlocks;
                        lexer->excludeBlocks = no;

                        if (node->type != TextNode)
                        {
                            TidyParserMemory memory = {0};
                            memory.identity = TY_(ParseRow);
                            memory.original_node = row;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_ENDTAG;
                            memory.register_1 = exclude_state;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        lexer->exiled = no;
                        lexer->excludeBlocks = exclude_state;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead( doc, row, node);
                        continue;
                    }
                }

                if ( !(nodeIsTD(node) || nodeIsTH(node)) )
                {
                    TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <TD> or <TH> */
                TY_(InsertNodeAtEnd)(row, node);
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseRow);
                    memory.original_node = row;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_TD_TH;
                    memory.register_1 = exclude_state;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }
            } break;
                
                
            case STATE_POST_NOT_ENDTAG:
            {
                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            case STATE_POST_TD_TH:
            {
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */

                /* pop inline stack */
                while ( lexer->istacksize > lexer->istackbase )
                    TY_(PopInline)( doc, NULL );
                
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            default:
                break;
                
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}